

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall tcu::ThreadUtil::Thread::pushMessage(Thread *this,string *str)

{
  deUint64 time;
  undefined1 local_40 [40];
  
  de::Mutex::lock(&this->m_messageLock);
  time = deGetMicroseconds();
  Message::Message((Message *)local_40,time,(str->_M_dataplus)._M_p);
  std::vector<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>::
  emplace_back<tcu::ThreadUtil::Message>(&this->m_messages,(Message *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  de::Mutex::unlock(&this->m_messageLock);
  return;
}

Assistant:

void Thread::pushMessage (const std::string& str)
{
	de::ScopedLock lock(m_messageLock);
	m_messages.push_back(Message(deGetMicroseconds(), str.c_str()));
}